

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

uint * __thiscall
cimg_library::CImg<unsigned_int>::max_min<float>(CImg<unsigned_int> *this,float *min_val)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  uint *puVar4;
  CImgInstanceException *this_00;
  uint uVar5;
  uint *ptrs;
  uint *puVar6;
  uint uVar7;
  char *pcVar8;
  
  bVar3 = is_empty(this);
  if (bVar3) {
    this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
    pcVar8 = "non-";
    if (this->_is_shared != false) {
      pcVar8 = "";
    }
    CImgInstanceException::CImgInstanceException
              (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
               (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar8,"unsigned int");
    __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgException::~CImgException);
  }
  puVar4 = this->_data;
  uVar5 = *puVar4;
  puVar1 = puVar4 + (ulong)this->_spectrum * (ulong)this->_depth *
                    (ulong)this->_height * (ulong)this->_width;
  uVar7 = uVar5;
  for (puVar6 = puVar4; puVar6 < puVar1; puVar6 = puVar6 + 1) {
    uVar2 = *puVar6;
    if (uVar7 < uVar2) {
      puVar4 = puVar6;
      uVar7 = uVar2;
    }
    if (uVar2 < uVar5) {
      uVar5 = uVar2;
    }
  }
  *min_val = (float)uVar5;
  return puVar4;
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }